

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.cpp
# Opt level: O2

void __thiscall VulkanUtilities::RenderingInfoWrapper::ResetClears(RenderingInfoWrapper *this)

{
  VkClearValue *pVVar1;
  uint uVar2;
  VkRenderingAttachmentInfo *pVVar3;
  uint uVar4;
  uint uVar5;
  string msg;
  
  while (uVar2 = this->m_AttachmentClearMask, uVar2 != 0) {
    uVar5 = uVar2 - 1 & uVar2;
    this->m_AttachmentClearMask = uVar5;
    uVar4 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    if ((((this->m_RI).colorAttachmentCount -
         (uint)((this->m_RI).pDepthAttachment == (VkRenderingAttachmentInfo *)0x0)) + 2) -
        (uint)((this->m_RI).pStencilAttachment == (VkRenderingAttachmentInfo *)0x0) <= uVar4) {
      Diligent::FormatString<char[26],char[124]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Idx < m_RI.colorAttachmentCount + (m_RI.pDepthAttachment != nullptr ? 1 : 0) + (m_RI.pStencilAttachment != nullptr ? 1 : 0)"
                 ,(char (*) [124])(ulong)uVar5);
      Diligent::DebugAssertionFailed
                (msg._M_dataplus._M_p,"ResetClears",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/RenderingInfoWrapper.cpp"
                 ,0x5e);
      std::__cxx11::string::~string((string *)&msg);
    }
    pVVar3 = (this->m_Attachments)._M_t.
             super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
             .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl;
    pVVar3[uVar4].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    pVVar1 = &pVVar3[uVar4].clearValue;
    *(float *)pVVar1 = 0.0;
    *(uint32_t *)((long)&pVVar1->depthStencil + 4) = 0;
    ((VkClearDepthStencilValue *)((long)pVVar1 + 8))->depth = 0.0;
    ((VkClearDepthStencilValue *)((long)pVVar1 + 8))->stencil = 0;
  }
  return;
}

Assistant:

void RenderingInfoWrapper::ResetClears()
{
    while (m_AttachmentClearMask != 0)
    {
        uint32_t Bit = Diligent::ExtractLSB(m_AttachmentClearMask);
        uint32_t Idx = Diligent::PlatformMisc::GetLSB(Bit);
        VERIFY_EXPR(Idx < m_RI.colorAttachmentCount + (m_RI.pDepthAttachment != nullptr ? 1 : 0) + (m_RI.pStencilAttachment != nullptr ? 1 : 0));
        m_Attachments[Idx].loadOp     = VK_ATTACHMENT_LOAD_OP_LOAD;
        m_Attachments[Idx].clearValue = {};
    }
}